

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

size_t PHF::uniq<std::__cxx11::string>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,size_t n)

{
  bool bVar1;
  size_t local_30;
  long local_28;
  size_t j;
  size_t i;
  size_t n_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  
  qsort(k,n,0x20,Uniq::cmp<std::__cxx11::string>);
  local_28 = 0;
  for (j = 1; j < n; j = j + 1) {
    bVar1 = std::operator!=(k + j * 0x20,k + local_28 * 0x20);
    if (bVar1) {
      local_28 = local_28 + 1;
      std::__cxx11::string::operator=((string *)(k + local_28 * 0x20),(string *)(k + j * 0x20));
    }
  }
  if (n == 0) {
    local_30 = 0;
  }
  else {
    local_30 = local_28 + 1;
  }
  return local_30;
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}